

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test1DLinearResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceMips_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  CTestGen9Resource_Test1DLinearResourceMips_Test *this_01;
  bool bVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  undefined1 in_XMM5 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  undefined4 local_150;
  undefined4 local_14c;
  undefined8 local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  undefined8 local_128;
  ulong uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined5 local_e8;
  undefined1 auStack_e3 [11];
  undefined8 local_d8;
  CTestGen9Resource_Test1DLinearResourceMips_Test *local_d0;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_68;
  ulong local_60;
  uint local_54;
  uint32_t StartOfMip;
  internal local_48 [8];
  AssertionResult gtest_ar;
  ulong uVar23;
  
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_128 = 0;
  local_138 = (undefined1  [16])0x0;
  local_d8 = 0;
  local_150 = 1;
  auStack_e3 = SUB1611((undefined1  [16])0x0,5);
  local_e8 = 0x100000000;
  local_140 = 0x80000;
  local_148 = 0x400000000;
  local_118._0_12_ = ZEXT412(5) << 0x40;
  local_118._12_4_ = 0;
  uVar7 = 0;
  this_00 = &gtest_ar.message_;
  local_d0 = this;
  do {
    local_14c = (&DAT_001a7f2c)[uVar7];
    uStack_120 = 0x100;
    local_118._0_4_ = 1;
    local_60 = uVar7;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_150);
    this_01 = local_d0;
    uVar3 = (int)uStack_120 + 0x3fU & 0xffffffc0;
    if (local_118._8_4_ != 0) {
      lVar5 = (ulong)(local_118._8_4_ + 1) - 2;
      auVar13._8_4_ = (int)lVar5;
      auVar13._0_8_ = lVar5;
      auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar18._8_4_ = (int)uStack_120;
      auVar18._0_8_ = uStack_120;
      auVar18._12_4_ = (int)(uStack_120 >> 0x20);
      lVar5 = 4;
      auVar16 = pmovsxbq(in_XMM4,0x201);
      auVar20 = pmovsxbq(in_XMM5,0x403);
      in_XMM9 = pmovsxbd(in_XMM9,0x3f3f3f3f);
      in_XMM10 = pmovsxbd(in_XMM10,0xc0c0c0c0);
      in_XMM11 = pmovsxbq(in_XMM11,0x404);
      auVar11 = ZEXT416(uVar3);
      do {
        auVar9 = auVar11;
        lVar15 = auVar16._0_8_;
        uVar23 = auVar18._8_8_;
        auVar21._0_8_ = uStack_120 >> lVar15;
        auVar21._8_8_ = uVar23 >> lVar15;
        lVar14 = auVar16._8_8_;
        auVar10._0_8_ = uStack_120 >> lVar14;
        auVar10._8_8_ = uVar23 >> lVar14;
        auVar11 = pblendw(auVar10,auVar21,0xf);
        lVar19 = auVar20._0_8_;
        auVar22._0_8_ = uStack_120 >> lVar19;
        auVar22._8_8_ = uVar23 >> lVar19;
        lVar1 = auVar20._8_8_;
        auVar24._0_8_ = uStack_120 >> lVar1;
        auVar24._8_8_ = uVar23 >> lVar1;
        auVar16 = pblendw(auVar24,auVar22,0xf);
        auVar12._0_4_ = auVar11._0_4_ + in_XMM9._0_4_;
        auVar12._4_4_ = auVar11._8_4_ + in_XMM9._4_4_;
        auVar12._8_4_ = auVar16._0_4_ + in_XMM9._8_4_;
        auVar12._12_4_ = auVar16._8_4_ + in_XMM9._12_4_;
        auVar12 = auVar12 & in_XMM10;
        auVar11._0_4_ = auVar12._0_4_ + auVar9._0_4_;
        auVar11._4_4_ = auVar12._4_4_ + auVar9._4_4_;
        auVar11._8_4_ = auVar12._8_4_ + auVar9._8_4_;
        auVar11._12_4_ = auVar12._12_4_ + auVar9._12_4_;
        auVar16._0_8_ = lVar15 + in_XMM11._0_8_;
        auVar16._8_8_ = lVar14 + in_XMM11._8_8_;
        auVar20._0_8_ = lVar19 + in_XMM11._0_8_;
        auVar20._8_8_ = lVar1 + in_XMM11._8_8_;
        lVar14 = (((ulong)(local_118._8_4_ + 1) + 2 & 0xfffffffffffffffc) - 4) + lVar5;
        lVar5 = lVar5 + -4;
      } while (lVar14 != 4);
      lVar5 = -lVar5;
      auVar17._8_4_ = (int)lVar5;
      auVar17._0_8_ = lVar5;
      auVar17._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar18 = (auVar17 | _DAT_001a5800) ^ _DAT_001a57f0;
      lVar5 = SUB168(auVar13 ^ _DAT_001a57f0,0);
      in_XMM4._0_8_ = -(ulong)(lVar5 < auVar18._0_8_);
      lVar14 = SUB168(auVar13 ^ _DAT_001a57f0,8);
      in_XMM4._8_8_ = -(ulong)(lVar14 < auVar18._8_8_);
      auVar18 = (auVar17 | _DAT_001a57e0) ^ _DAT_001a57f0;
      auVar8._0_8_ = -(ulong)(lVar5 < auVar18._0_8_);
      auVar8._8_8_ = -(ulong)(lVar14 < auVar18._8_8_);
      auVar18 = packssdw(auVar8,in_XMM4);
      auVar11 = blendvps(auVar11,auVar9,auVar18);
      auVar11 = phaddd(auVar11,auVar11);
      auVar11 = phaddd(auVar11,auVar11);
      uVar3 = auVar11._0_4_;
      in_XMM5 = _DAT_001a57f0;
    }
    iVar4 = 0;
    if ((uint)uVar7 < 5) {
      iVar4 = (&DAT_001a7f18)[local_60];
    }
    local_68 = uVar7;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_d0,ResourceInfo,0x40);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_01,ResourceInfo,(ulong)(iVar4 * uVar3 + 0xfff & 0xfffff000));
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    stack0xffffffffffffff3c = SUB1612((undefined1  [16])0x0,4);
    local_c8._0_4_ = 1;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,local_c8);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,(unsigned_long *)local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdc,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,(uint *)(local_98 + 8));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdd,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,(uint *)(local_98 + 0xc));
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xde,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,(uint *)local_88);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar6 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar6 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdf,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_54 = 0;
    if (local_118._8_4_ != 0) {
      uVar7 = 1;
      do {
        local_78 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_a8 = (undefined1  [16])0x0;
        local_b8 = (undefined1  [16])0x0;
        stack0xffffffffffffff3c = SUB1612((undefined1  [16])0x0,4);
        local_c8._0_4_ = 1;
        uStack_c0 = (int)uVar7;
        uStack_bc = 0;
        (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,local_c8);
        iVar4 = 0;
        if ((uint)local_68 < 5) {
          iVar4 = (&DAT_001a7f18)[local_60];
        }
        local_54 = local_54 +
                   ((int)(uStack_120 >> ((char)uVar7 - 1U & 0x3f)) + 0x3fU & 0xffffffc0) * iVar4;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  (local_48,"StartOfMip","OffsetInfo.Render.Offset64",&local_54,
                   (unsigned_long *)local_98);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar6 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xea,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
                (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                             gtest_ar.message_.ptr_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,(uint *)(local_98 + 8));
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar6 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xeb,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
                (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                             gtest_ar.message_.ptr_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,(uint *)(local_98 + 0xc))
        ;
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar6 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xec,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
                (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                             gtest_ar.message_.ptr_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        gtest_ar.message_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,(uint *)local_88);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          pcVar6 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0xed,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
                (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                             gtest_ar.message_.ptr_._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = uVar7 < (uint)local_118._8_4_;
        uVar7 = uVar7 + 1;
      } while (bVar2);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    uVar3 = (int)local_68 + 1;
    uVar7 = (ulong)uVar3;
  } while (uVar3 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceMips)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate 256x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x100;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, HAlign);
        }
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // Mip0 should be at offset 0. X/Y/Z Offset should be 0 for linear.
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // All mips should be right after one another linearly
        uint32_t StartOfMip = 0;
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), HAlign) * GetBppValue(bpp);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}